

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdReplace<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,unsigned_int>
          (Thread *this,Instr instr)

{
  Simd<unsigned_short,_(unsigned_char)__b_> value;
  Simd<unsigned_short,_(unsigned_char)__b_> simd;
  uint val;
  Thread *this_local;
  
  unique0x100000ab = this;
  simd.v._8_4_ = Pop<unsigned_int>(this);
  value = Pop<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this);
  simd.v[(ulong)instr.field_2.imm_u8 - 4] = simd.v[4];
  Push<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdReplace(Instr instr) {
  auto val = Pop<T>();
  auto simd = Pop<R>();
  simd.v[instr.imm_u8] = val;
  Push(simd);
  return RunResult::Ok;
}